

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DynamicTypeHandler::SetInlineSlot
          (DynamicTypeHandler *this,DynamicObject *instance,PropertyId propertyId,bool allowLetConst
          ,int index,Var value)

{
  FinalizableObject *addr;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    bVar2 = ThreadContext::IsOnStack(value);
    if (bVar2) {
      bVar2 = VarIs<Js::RecyclableObject>(value);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0x9f,
                                    "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                    ,
                                    "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                                   );
        if (!bVar2) goto LAB_00e4c29a;
        *puVar5 = 0;
      }
    }
  }
  uVar3 = (uint)(this->offsetOfInlineSlots >> 3);
  if (index < (int)uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xa0,"(index >= (int)(offsetOfInlineSlots / sizeof(Var)))",
                                "index should be relative to the address of the object");
    if (!bVar2) goto LAB_00e4c29a;
    *puVar5 = 0;
    uVar3 = (uint)(this->offsetOfInlineSlots >> 3);
  }
  if ((int)(uint)this->inlineSlotCapacity <= (int)(index - uVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0xa1,
                                "(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity())"
                                ,
                                "index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity()"
                               );
    if (!bVar2) goto LAB_00e4c29a;
    *puVar5 = 0;
  }
  if (propertyId != -1) {
    iVar4 = (*this->_vptr_DynamicTypeHandler[0x56])
                      (this,instance,(ulong)(uint)propertyId,(ulong)allowLetConst);
    if ((char)iVar4 == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0xa2,
                                  "(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst))"
                                  ,
                                  "propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst)"
                                 );
      if (!bVar2) {
LAB_00e4c29a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  addr = &(instance->super_RecyclableObject).super_FinalizableObject + index;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = (_func_int **)value;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void DynamicTypeHandler::SetInlineSlot(DynamicObject* instance, int index, Var value)
#endif
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        AssertMsg(index >= (int)(offsetOfInlineSlots / sizeof(Var)), "index should be relative to the address of the object");
        Assert(index - (int)(offsetOfInlineSlots / sizeof(Var)) < this->GetInlineSlotCapacity());
        Assert(propertyId == Constants::NoProperty || CanStorePropertyValueDirectly(instance, propertyId, allowLetConst));

        Field(Var) * slots = reinterpret_cast<Field(Var)*>(instance);
        slots[index] = value;
    }